

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O0

void __thiscall Jzon::Parser::readString(Parser *this,istream *stream,DataQueue *data)

{
  undefined8 this_00;
  int iVar1;
  int_type iVar2;
  Type local_84;
  pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  char local_42;
  char local_41;
  undefined1 local_40 [6];
  char c2;
  char c1;
  string str;
  DataQueue *data_local;
  istream *stream_local;
  Parser *this_local;
  
  str.field_2._8_8_ = data;
  std::__cxx11::string::string((string *)local_40);
  local_41 = '\0';
  while( true ) {
    local_42 = local_41;
    iVar1 = std::istream::peek();
    iVar2 = std::char_traits<char>::eof();
    if ((iVar1 == iVar2) ||
       ((std::istream::get((char *)stream), local_41 != '\\' && (local_42 == '\"')))) break;
    std::__cxx11::string::operator+=((string *)local_40,local_42);
    local_41 = local_42;
  }
  this_00 = str.field_2._8_8_;
  local_84 = T_STRING;
  std::make_pair<Jzon::Node::Type,std::__cxx11::string&>
            (&local_80,&local_84,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::
  queue<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::push((queue<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *)this_00,&local_80);
  std::
  pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_80);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Parser::readString(std::istream &stream, DataQueue &data)
	{
		std::string str;

		char c1 = '\0', c2 = '\0';
		while (stream.peek() != std::char_traits<char>::eof())
		{
			stream.get(c2);

			if (c1 != '\\' && c2 == '"')
			{
				break;
			}

			str += c2;

			c1 = c2;
		}

		data.push(std::make_pair(Node::T_STRING, str));
	}